

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,bool test_value)

{
  Am_ID_Tag AVar1;
  uint uVar2;
  char *pcVar3;
  double dVar4;
  bool test_value_local;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0) {
    uVar2 = (uint)this->type;
    if (uVar2 - 2 < 2) {
      this_local._7_1_ = ((this->value).wrapper_value != (Am_Wrapper *)0x0) != test_value;
    }
    else if (uVar2 == 4) {
      this_local._7_1_ = (bool)((this->value).char_value & 1U) != test_value;
    }
    else if (uVar2 == 5) {
      this_local._7_1_ = ((this->value).float_value != 0.0) != test_value;
    }
    else if (uVar2 == 7) {
      this_local._7_1_ = ((this->value).bool_value != false) != test_value;
    }
    else if (uVar2 == 9) {
      this_local._7_1_ = ((this->value).wrapper_value != (Am_Wrapper *)0x0) != test_value;
    }
    else if (uVar2 == 10) {
      this_local._7_1_ = ((this->value).wrapper_value != (Am_Wrapper *)0x0) != test_value;
    }
    else if (uVar2 == 0x8006) {
      dVar4 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value)
      ;
      this_local._7_1_ = (dVar4 != 0.0) != test_value;
    }
    else if (uVar2 == 0x8008) {
      pcVar3 = Am_String_Data::operator_cast_to_char_((Am_String_Data *)(this->value).wrapper_value)
      ;
      this_local._7_1_ = (pcVar3 != (char *)0x0) != test_value;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = ((this->value).wrapper_value != (Am_Wrapper *)0x0) != test_value;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator!=(bool test_value) const
{
  if (Am_Type_Class(type) != Am_NONE)
    return !!value.voidptr_value != test_value;
  switch (type) {
  case Am_INT:
  case Am_LONG:
    return !!value.long_value != test_value;
  case Am_BOOL:
    return value.bool_value != test_value;
  case Am_FLOAT:
    return !!value.float_value != test_value;
  case Am_DOUBLE:
    return !!(double)*(Am_Double_Data *)value.wrapper_value != test_value;
  case Am_CHAR:
    return !!value.char_value != test_value;
  case Am_STRING:
    return !!(const char *)*(Am_String_Data *)value.wrapper_value != test_value;
  case Am_VOIDPTR:
    return !!value.voidptr_value != test_value;
  case Am_PROC:
    return !!value.proc_value != test_value;
  default:
    return true;
  }
}